

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

bool commandLineOffOnOk(HighsLogOptions *report_log_options,string *name,string *value)

{
  __type _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  HighsLogOptions *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  _Var1 = std::operator==(in_RDX,in_stack_ffffffffffffffd8);
  if ((!_Var1) && (_Var1 = std::operator==(in_RDX,in_stack_ffffffffffffffd8), !_Var1)) {
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    highsLogUser(in_RDI,kWarning,"Value \"%s\" for %s option is not one of \"%s\" or \"%s\"\n",uVar2
                 ,uVar3,uVar4,uVar5);
    return false;
  }
  return true;
}

Assistant:

bool commandLineOffOnOk(const HighsLogOptions& report_log_options,
                        const string& name, const string& value) {
  if (value == kHighsOffString || value == kHighsOnString) return true;
  highsLogUser(report_log_options, HighsLogType::kWarning,
               "Value \"%s\" for %s option is not one of \"%s\" or \"%s\"\n",
               value.c_str(), name.c_str(), kHighsOffString.c_str(),
               kHighsOnString.c_str());
  return false;
}